

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

int64_t __thiscall embree::TutorialApplication::getNumRays(TutorialApplication *this)

{
  int iVar1;
  size_t i;
  int64_t numRays;
  ulong local_18;
  long local_10;
  
  local_10 = 0;
  local_18 = 0;
  while( true ) {
    iVar1 = tbb::detail::d1::max_concurrency();
    if ((ulong)(long)iVar1 <= local_18) break;
    local_10 = g_stats[local_18].numRays + local_10;
    local_18 = local_18 + 1;
  }
  return local_10;
}

Assistant:

int64_t TutorialApplication::getNumRays()
  {
    int64_t numRays = 0;
    for (size_t i = 0; i < TaskScheduler::threadCount(); i++)
      numRays += g_stats[i].numRays;
    return numRays;
  }